

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glyph.cc
# Opt level: O2

bool woff2::ReadCompositeGlyphData(Buffer *buffer,Glyph *glyph)

{
  long lVar1;
  size_t sVar2;
  bool bVar3;
  undefined8 in_RAX;
  ulong uVar4;
  size_t n_bytes;
  uint16_t flags;
  undefined8 uStack_28;
  
  glyph->have_instructions = false;
  sVar2 = buffer->offset_;
  glyph->composite_data = buffer->buffer_ + sVar2;
  uStack_28 = CONCAT26(0x20,(int6)in_RAX);
  while( true ) {
    if ((uStack_28 & 0x20000000000000) == 0) {
      uVar4 = buffer->offset_ - sVar2;
      if (uVar4 >> 0x20 != 0) {
        return false;
      }
      glyph->composite_data_size = (uint32_t)uVar4;
      return true;
    }
    bVar3 = Buffer::ReadU16(buffer,(uint16_t *)((long)&uStack_28 + 6));
    if (!bVar3) break;
    glyph->have_instructions = (bool)(glyph->have_instructions | (byte)(uStack_28 >> 0x38) & 1);
    lVar1 = (ulong)(uStack_28._6_2_ & 1) * 2;
    if ((uStack_28 & 0x8000000000000) == 0) {
      if ((uStack_28 & 0x40000000000000) == 0) {
        n_bytes = lVar1 + 4U | (ulong)(uStack_28._6_2_ >> 4 & 8);
      }
      else {
        n_bytes = lVar1 + 8;
      }
    }
    else {
      n_bytes = lVar1 + 6;
    }
    bVar3 = Buffer::Skip(buffer,n_bytes);
    if (!bVar3) {
      return false;
    }
  }
  return false;
}

Assistant:

bool ReadCompositeGlyphData(Buffer* buffer, Glyph* glyph) {
  glyph->have_instructions = false;
  glyph->composite_data = buffer->buffer() + buffer->offset();
  size_t start_offset = buffer->offset();
  uint16_t flags = kFLAG_MORE_COMPONENTS;
  while (flags & kFLAG_MORE_COMPONENTS) {
    if (!buffer->ReadU16(&flags)) {
      return FONT_COMPRESSION_FAILURE();
    }
    glyph->have_instructions |= (flags & kFLAG_WE_HAVE_INSTRUCTIONS) != 0;
    size_t arg_size = 2;  // glyph index
    if (flags & kFLAG_ARG_1_AND_2_ARE_WORDS) {
      arg_size += 4;
    } else {
      arg_size += 2;
    }
    if (flags & kFLAG_WE_HAVE_A_SCALE) {
      arg_size += 2;
    } else if (flags & kFLAG_WE_HAVE_AN_X_AND_Y_SCALE) {
      arg_size += 4;
    } else if (flags & kFLAG_WE_HAVE_A_TWO_BY_TWO) {
      arg_size += 8;
    }
    if (!buffer->Skip(arg_size)) {
      return FONT_COMPRESSION_FAILURE();
    }
  }
  if (buffer->offset() - start_offset > std::numeric_limits<uint32_t>::max()) {
    return FONT_COMPRESSION_FAILURE();
  }
  glyph->composite_data_size = buffer->offset() - start_offset;
  return true;
}